

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

int __thiscall
TPZCompElHCurl<pzshape::TPZShapeCube>::EffectiveSideOrder
          (TPZCompElHCurl<pzshape::TPZShapeCube> *this,int side)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 in_ESI;
  long *in_RDI;
  stringstream sout;
  int connect;
  char *in_stack_00000210;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  int local_18;
  undefined4 local_14;
  int local_4;
  
  local_14 = in_ESI;
  iVar1 = (**(code **)(*in_RDI + 0x248))(in_RDI,in_ESI);
  if (iVar1 == 0) {
    local_4 = -1;
  }
  else {
    iVar1 = (**(code **)(*in_RDI + 0x310))(in_RDI,local_14);
    local_18 = iVar1;
    if ((iVar1 < 0) && (iVar2 = (**(code **)(*in_RDI + 0x90))(), iVar2 <= iVar1)) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      poVar3 = std::operator<<(local_190,
                               "virtual int TPZCompElHCurl<pzshape::TPZShapeCube>::EffectiveSideOrder(int) const [TSHAPE = pzshape::TPZShapeCube]"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(local_190,"Connect index out of range connect ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
      poVar3 = std::operator<<(poVar3," nconnects ");
      iVar1 = (**(code **)(*in_RDI + 0x90))();
      std::ostream::operator<<(poVar3,iVar1);
      std::__cxx11::stringstream::str();
      poVar3 = std::operator<<((ostream *)&std::cerr,local_1d0);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1d0);
      pzinternal::DebugStopImpl(in_stack_00000210,(size_t)this);
      std::__cxx11::stringstream::~stringstream(local_1a0);
      return -1;
    }
    local_4 = (**(code **)(*in_RDI + 0x3c0))(in_RDI,local_18);
  }
  return local_4;
}

Assistant:

int TPZCompElHCurl<TSHAPE>::EffectiveSideOrder(int side) const{
	if(!NSideConnects(side)) return -1;
	const auto connect = this->MidSideConnectLocId( side);
	if(connect >= 0 || connect < NConnects()){
        return ConnectOrder(connect);
	}
    else{
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__<<std::endl;
        sout << "Connect index out of range connect " << connect << " nconnects " << NConnects();
        PZError<<sout.str()<<std::endl;
#ifdef PZ_LOG
        LOGPZ_ERROR(logger, sout.str())
#endif
        DebugStop();
    }
	return -1;
}